

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_RegExpDelete(JSContext *ctx,JSValue this_val,JSValue arg)

{
  JSValue val_00;
  JSValue val_01;
  JSValue v;
  JSValue v_00;
  JSValue val_02;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue this_obj_01;
  JSValue obj;
  undefined1 auVar1 [16];
  int iVar2;
  JSRegExp *pJVar3;
  JSContext *in_RDI;
  JSValue JVar4;
  StringBuffer *b;
  StringBuffer b_s;
  int64_t last_index;
  int end;
  int start;
  int next_src_pos;
  int re_flags;
  int shift;
  int capture_count;
  uint8_t *str_buf;
  uint8_t **capture;
  int ret;
  uint8_t *re_bytecode;
  JSValue val;
  JSValue str_val;
  JSString *str;
  JSRegExp *re;
  uint32_t in_stack_fffffffffffffe68;
  JSAtom in_stack_fffffffffffffe6c;
  JSContext *in_stack_fffffffffffffe70;
  StringBuffer *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  BOOL in_stack_fffffffffffffe84;
  JSValueUnion in_stack_fffffffffffffe88;
  JSValueUnion in_stack_fffffffffffffe90;
  int64_t in_stack_fffffffffffffe98;
  JSValueUnion local_150;
  long local_118;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  int local_fc;
  uint8_t *local_f8;
  uint8_t **local_f0;
  int local_e4;
  JSString *local_e0;
  JSValueUnion local_d8;
  int64_t local_d0;
  JSValueUnion local_c8;
  JSValueUnion p;
  JSValueUnion local_80;
  int64_t local_78;
  JSValueUnion local_50;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uStack_c;
  
  JVar4.tag = in_stack_fffffffffffffe98;
  JVar4.u.float64 = in_stack_fffffffffffffe90.float64;
  pJVar3 = js_get_regexp((JSContext *)in_stack_fffffffffffffe88.ptr,JVar4,in_stack_fffffffffffffe84)
  ;
  if (pJVar3 == (JSRegExp *)0x0) {
    local_80.ptr = (void *)(local_80 << 0x20);
    local_78 = 6;
    return _local_80;
  }
  string_buffer_init(in_stack_fffffffffffffe70,
                     (StringBuffer *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0
                    );
  local_f0 = (uint8_t **)0x0;
  val_00.u._4_4_ = in_stack_fffffffffffffe6c;
  val_00.u.int32 = in_stack_fffffffffffffe68;
  val_00.tag = (int64_t)in_stack_fffffffffffffe70;
  JVar4 = JS_ToString((JSContext *)0x175827,val_00);
  local_150 = JVar4.u;
  local_c8 = local_150;
  iVar2 = JS_IsException(JVar4);
  if (iVar2 == 0) {
    local_e0 = pJVar3->bytecode + 1;
    p = local_c8;
    local_104 = lre_get_flags((uint8_t *)local_e0);
    if ((local_104 & 0x21) == 0) {
      local_118 = 0;
    }
    else {
      in_stack_fffffffffffffe68 = 0;
      obj.tag._0_4_ = in_stack_ffffffffffffffe0;
      obj.u = (JSValueUnion)in_stack_ffffffffffffffd8;
      obj.tag._4_4_ = in_stack_ffffffffffffffe4;
      this_obj_01.tag._0_4_ = in_stack_ffffffffffffffd0;
      this_obj_01.u = (JSValueUnion)in_stack_ffffffffffffffc8;
      this_obj_01.tag._4_4_ = in_stack_ffffffffffffffd4;
      JVar4 = JS_GetPropertyInternal
                        ((JSContext *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         obj,local_50._12_4_,this_obj_01,(BOOL)b_s.ctx);
      local_50 = JVar4.u;
      local_d8 = local_50;
      local_d0 = JVar4.tag;
      iVar2 = JS_IsException(JVar4);
      if ((iVar2 != 0) ||
         (val_02.tag = (int64_t)in_stack_fffffffffffffe90.ptr,
         val_02.u.ptr = in_stack_fffffffffffffe88.ptr,
         iVar2 = JS_ToLengthFree((JSContext *)
                                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                 (int64_t *)in_stack_fffffffffffffe78,val_02), iVar2 != 0))
      goto LAB_00175e09;
    }
    local_fc = lre_get_capture_count((uint8_t *)local_e0);
    if ((local_fc < 1) ||
       (local_f0 = (uint8_t **)
                   js_malloc((JSContext *)in_stack_fffffffffffffe88.ptr,
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)),
       local_f0 != (uint8_t **)0x0)) {
      local_100 = (uint)((byte)(*(ulong *)((long)p.ptr + 4) >> 0x1f) & 1);
      local_f8 = (uint8_t *)((long)p.ptr + 0x10);
      local_108 = 0;
      while (local_118 <= (long)(ulong)((uint)*(undefined8 *)((long)p.ptr + 4) & 0x7fffffff)) {
        in_stack_fffffffffffffe68 = (uint32_t)in_RDI;
        in_stack_fffffffffffffe6c = (JSAtom)((ulong)in_RDI >> 0x20);
        local_e4 = lre_exec(local_f0,(uint8_t *)local_e0,local_f8,(int)local_118,
                            (uint)*(undefined8 *)((long)p.ptr + 4) & 0x7fffffff,local_100,in_RDI);
        if (local_e4 != 1) {
          if (local_e4 < 0) {
            JVar4 = JS_ThrowInternalError(in_RDI,"out of memory in regexp execution");
            in_stack_fffffffffffffe80 = JVar4.u._0_4_;
            in_stack_fffffffffffffe84 = JVar4.u._4_4_;
            goto LAB_00175e09;
          }
          if ((local_e4 == 2) || ((local_104 & 0x21) != 0)) {
            this_obj.tag = (ulong)uStack_c << 0x20;
            this_obj.u.ptr = in_stack_fffffffffffffe88.ptr;
            val_01.tag._0_4_ = in_stack_fffffffffffffe80;
            val_01.u.ptr = in_stack_fffffffffffffe78;
            val_01.tag._4_4_ = in_stack_fffffffffffffe84;
            iVar2 = JS_SetProperty(in_stack_fffffffffffffe70,this_obj,in_stack_fffffffffffffe6c,
                                   val_01);
joined_r0x00175b7d:
            if (iVar2 < 0) goto LAB_00175e09;
          }
          break;
        }
        local_10c = (uint)((long)*local_f0 - (long)local_f8 >> ((byte)local_100 & 0x3f));
        local_110 = (uint)((long)local_f0[1] - (long)local_f8 >> ((byte)local_100 & 0x3f));
        if (((int)local_108 < (int)local_10c) &&
           (iVar2 = string_buffer_concat
                              (in_stack_fffffffffffffe78,(JSString *)in_stack_fffffffffffffe70,
                               in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68), iVar2 != 0))
        goto LAB_00175e09;
        local_108 = local_110;
        if ((local_104 & 1) == 0) {
          in_stack_fffffffffffffe70 = (JSContext *)CONCAT44(in_stack_ffffffffffffffd4,local_110);
          in_stack_fffffffffffffe78 = (StringBuffer *)0x0;
          this_obj_00.tag = (int64_t)in_stack_fffffffffffffe90.ptr;
          this_obj_00.u.ptr = in_stack_fffffffffffffe88.ptr;
          auVar1._4_4_ = in_stack_fffffffffffffe84;
          auVar1._0_4_ = in_stack_fffffffffffffe80;
          auVar1._8_8_ = 0;
          iVar2 = JS_SetProperty(in_stack_fffffffffffffe70,this_obj_00,in_stack_fffffffffffffe6c,
                                 (JSValue)(auVar1 << 0x40));
          goto joined_r0x00175b7d;
        }
        if (local_110 == local_10c) {
          if ((((local_104 & 0x10) == 0) ||
              (((uint)*(undefined8 *)((long)p.ptr + 4) & 0x7fffffff) <= local_110)) ||
             ((*(ulong *)((long)p.ptr + 4) >> 0x1f & 1) == 0)) {
            local_110 = local_110 + 1;
          }
          else {
            string_getc((JSString *)p.ptr,(int *)&local_110);
          }
        }
        local_118 = (long)(int)local_110;
      }
      iVar2 = string_buffer_concat
                        (in_stack_fffffffffffffe78,(JSString *)in_stack_fffffffffffffe70,
                         in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
      if (iVar2 == 0) {
        v.tag._0_4_ = in_stack_fffffffffffffe80;
        v.u.ptr = in_stack_fffffffffffffe78;
        v.tag._4_4_ = in_stack_fffffffffffffe84;
        JS_FreeValue(in_stack_fffffffffffffe70,v);
        js_free(in_stack_fffffffffffffe70,
                (void *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        JVar4 = string_buffer_end((StringBuffer *)in_stack_fffffffffffffe70);
        return JVar4;
      }
    }
  }
LAB_00175e09:
  v_00.tag._0_4_ = in_stack_fffffffffffffe80;
  v_00.u.ptr = in_stack_fffffffffffffe78;
  v_00.tag._4_4_ = in_stack_fffffffffffffe84;
  JS_FreeValue(in_stack_fffffffffffffe70,v_00);
  js_free(in_stack_fffffffffffffe70,
          (void *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  string_buffer_free((StringBuffer *)0x175e45);
  local_80.ptr = (void *)(local_80 << 0x20);
  local_78 = 6;
  return _local_80;
}

Assistant:

static JSValue JS_RegExpDelete(JSContext *ctx, JSValueConst this_val, JSValueConst arg)
{
    JSRegExp *re = js_get_regexp(ctx, this_val, TRUE);
    JSString *str;
    JSValue str_val, val;
    uint8_t *re_bytecode;
    int ret;
    uint8_t **capture, *str_buf;
    int capture_count, shift, re_flags;
    int next_src_pos, start, end;
    int64_t last_index;
    StringBuffer b_s, *b = &b_s;

    if (!re)
        return JS_EXCEPTION;

    string_buffer_init(ctx, b, 0);

    capture = NULL;
    str_val = JS_ToString(ctx, arg);
    if (JS_IsException(str_val))
        goto fail;
    str = JS_VALUE_GET_STRING(str_val);
    re_bytecode = re->bytecode->u.str8;
    re_flags = lre_get_flags(re_bytecode);
    if ((re_flags & (LRE_FLAG_GLOBAL | LRE_FLAG_STICKY)) == 0) {
        last_index = 0;
    } else {
        val = JS_GetProperty(ctx, this_val, JS_ATOM_lastIndex);
        if (JS_IsException(val) || JS_ToLengthFree(ctx, &last_index, val))
            goto fail;
    }
    capture_count = lre_get_capture_count(re_bytecode);
    if (capture_count > 0) {
        capture = js_malloc(ctx, sizeof(capture[0]) * capture_count * 2);
        if (!capture)
            goto fail;
    }
    shift = str->is_wide_char;
    str_buf = str->u.str8;
    next_src_pos = 0;
    for (;;) {
        if (last_index > str->len)
            break;

        ret = lre_exec(capture, re_bytecode,
                       str_buf, last_index, str->len, shift, ctx);
        if (ret != 1) {
            if (ret >= 0) {
                if (ret == 2 || (re_flags & (LRE_FLAG_GLOBAL | LRE_FLAG_STICKY))) {
                    if (JS_SetProperty(ctx, this_val, JS_ATOM_lastIndex,
                                       JS_NewInt32(ctx, 0)) < 0)
                        goto fail;
                }
            } else {
                JS_ThrowInternalError(ctx, "out of memory in regexp execution");
                goto fail;
            }
            break;
        }
        start = (capture[0] - str_buf) >> shift;
        end = (capture[1] - str_buf) >> shift;
        last_index = end;
        if (next_src_pos < start) {
            if (string_buffer_concat(b, str, next_src_pos, start))
                goto fail;
        }
        next_src_pos = end;
        if (!(re_flags & LRE_FLAG_GLOBAL)) {
            if (JS_SetProperty(ctx, this_val, JS_ATOM_lastIndex,
                               JS_NewInt32(ctx, end)) < 0)
                goto fail;
            break;
        }
        if (end == start) {
            if (!(re_flags & LRE_FLAG_UTF16) || (unsigned)end >= str->len || !str->is_wide_char) {
                end++;
            } else {
                string_getc(str, &end);
            }
        }
        last_index = end;
    }
    if (string_buffer_concat(b, str, next_src_pos, str->len))
        goto fail;
    JS_FreeValue(ctx, str_val);
    js_free(ctx, capture);
    return string_buffer_end(b);
fail:
    JS_FreeValue(ctx, str_val);
    js_free(ctx, capture);
    string_buffer_free(b);
    return JS_EXCEPTION;
}